

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O0

void IntsToStr(int *pInts,int Num,char *pStr)

{
  char *pStr_local;
  int Num_local;
  int *pInts_local;
  
  pStr_local = pStr;
  pInts_local = pInts;
  for (Num_local = Num; Num_local != 0; Num_local = Num_local + -1) {
    *pStr_local = (char)((uint)*pInts_local >> 0x18) + -0x80;
    pStr_local[1] = (char)((uint)*pInts_local >> 0x10) + -0x80;
    pStr_local[2] = (char)((uint)*pInts_local >> 8) + -0x80;
    pStr_local[3] = (char)*pInts_local + -0x80;
    pStr_local = pStr_local + 4;
    pInts_local = pInts_local + 1;
  }
  pStr_local[-1] = '\0';
  return;
}

Assistant:

inline void IntsToStr(const int *pInts, int Num, char *pStr)
{
	while(Num)
	{
		pStr[0] = (((*pInts)>>24)&0xff)-128;
		pStr[1] = (((*pInts)>>16)&0xff)-128;
		pStr[2] = (((*pInts)>>8)&0xff)-128;
		pStr[3] = ((*pInts)&0xff)-128;
		pStr += 4;
		pInts++;
		Num--;
	}

	// null terminate
	pStr[-1] = 0;
}